

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yl_opt.c
# Opt level: O2

int yl_opt_update_schema_out_format(char *arg,yl_opt *yo)

{
  LYS_OUTFORMAT LVar1;
  int iVar2;
  
  iVar2 = strcasecmp(arg,"yang");
  if (iVar2 == 0) {
    LVar1 = LYS_OUT_YANG;
  }
  else {
    iVar2 = strcasecmp(arg,"yin");
    if (iVar2 == 0) {
      LVar1 = LYS_OUT_YIN;
    }
    else {
      iVar2 = strcasecmp(arg,"info");
      if (iVar2 == 0) {
        LVar1 = LYS_OUT_YANG_COMPILED;
      }
      else {
        iVar2 = strcasecmp(arg,"tree");
        if (iVar2 != 0) {
          return 1;
        }
        LVar1 = LYS_OUT_TREE;
      }
    }
  }
  yo->schema_out_format = LVar1;
  yo->data_out_format = LYD_UNKNOWN;
  return 0;
}

Assistant:

int
yl_opt_update_schema_out_format(const char *arg, struct yl_opt *yo)
{
    if (!strcasecmp(arg, "yang")) {
        yo->schema_out_format = LYS_OUT_YANG;
        yo->data_out_format = 0;
    } else if (!strcasecmp(arg, "yin")) {
        yo->schema_out_format = LYS_OUT_YIN;
        yo->data_out_format = 0;
    } else if (!strcasecmp(arg, "info")) {
        yo->schema_out_format = LYS_OUT_YANG_COMPILED;
        yo->data_out_format = 0;
    } else if (!strcasecmp(arg, "tree")) {
        yo->schema_out_format = LYS_OUT_TREE;
        yo->data_out_format = 0;
    } else {
        return 1;
    }

    return 0;
}